

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O2

ssize_t __thiscall TCPConnection::read(TCPConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  deque<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ostream *poVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  uchar *__result;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_168;
  _Self local_158;
  const_iterator local_138;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_118;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_f8;
  iterator local_d0;
  _Self local_b0;
  const_iterator local_90;
  _Self local_70;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_50;
  
  __result = (uchar *)CONCAT44(in_register_00000034,__fd);
  std::unique_lock<std::mutex>::unique_lock(&uStack_168,&this->_read_m);
  if ((this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    __buf = (void *)0x0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"try to read");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"from server");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Available size is ");
    this_00 = &this->_recv_buf;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pvVar2 = (void *)std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    if (pvVar2 < __buf) {
      __buf = (void *)std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
      local_f8._M_cur =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_f8._M_first =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_f8._M_last =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
      local_f8._M_node =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      local_118._M_cur =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_118._M_first =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
      local_118._M_last =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_last;
      local_118._M_node =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node;
      std::copy<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,unsigned_char*>
                (&local_f8,&local_118,__result);
      hexDump((char *)0x0,__result,(int)__buf);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(this_00);
      if (this->state_ == ESTABLISHED) {
        this->_buffer_ready = false;
        *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ & 0xfe;
      }
    }
    else {
      local_158._M_cur =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_158._M_first =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_158._M_last =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
      local_158._M_node =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      local_50._M_cur = local_158._M_cur;
      local_50._M_first = local_158._M_first;
      local_50._M_last = local_158._M_last;
      local_50._M_node = local_158._M_node;
      std::operator+(&local_70,&local_158,(difference_type)__buf);
      std::copy<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,unsigned_char*>
                (&local_50,&local_70,__result);
      local_b0._M_cur =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_b0._M_first =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_b0._M_last =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
      local_b0._M_node =
           (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      local_90._M_cur = local_b0._M_cur;
      local_90._M_first = local_b0._M_first;
      local_90._M_last = local_b0._M_last;
      local_90._M_node = local_b0._M_node;
      std::operator+(&local_158,&local_b0,(difference_type)__buf);
      local_138._M_cur = local_158._M_cur;
      local_138._M_first = local_158._M_first;
      local_138._M_last = local_158._M_last;
      local_138._M_node = local_158._M_node;
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&local_d0,this_00,&local_90,&local_138);
      hexDump((char *)0x0,__result,(int)__buf);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_168);
  return (ssize_t)__buf;
}

Assistant:

ssize_t TCPConnection::read(uint8_t *buf, size_t size) {
    std::unique_lock lck(_read_m);
//    std::cout << "before wait" << std::endl;
//    _cv.wait(lck, [&] { return _buffer_ready; });
//    std::cout << "after wait" << std::endl;
    if (_recv_buf.empty()) {
        return 0;
    }
    std::cout << "try to read" << size << "from server" << std::endl;
    std::cout << "Available size is " << _recv_buf.size() << std::endl;
    if (size > _recv_buf.size()) {
        size_t read_size = _recv_buf.size();
        std::copy(_recv_buf.begin(), _recv_buf.end(), buf);
        hexDump(nullptr, buf, read_size);
        _recv_buf.clear();
        if (state_ == State::ESTABLISHED) {
            _buffer_ready = false;
            poll_flags_ &= ~POLLIN;
        }
        return read_size;
    } else {
        std::copy(_recv_buf.begin(), _recv_buf.begin() + size, buf);
        _recv_buf.erase(_recv_buf.begin(), _recv_buf.begin() + size);
        hexDump(nullptr, buf, size);
        return size;
    }
}